

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O1

void adios2::PrintMVI(ostream *os,MinVarInfo *mvi)

{
  uint uVar1;
  pointer pMVar2;
  ostream *poVar3;
  ulong uVar4;
  MinBlockInfo *blk;
  long lVar5;
  pointer pMVar6;
  ulong uVar7;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Step: ",6);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  Dims: ",8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,mvi->Dims);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," Shape: {",9);
  if ((mvi->Dims == 0) || (mvi->Shape == (size_t *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
  }
  else if (0 < mvi->Dims) {
    lVar5 = 0;
    do {
      std::ostream::_M_insert<unsigned_long>((ulong)os);
      if (lVar5 < (long)mvi->Dims + -1) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < mvi->Dims);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"}, BlockCount: ",0xf);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  pMVar2 = (mvi->BlocksInfo).
           super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar6 = (mvi->BlocksInfo).
                super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>.
                _M_impl.super__Vector_impl_data._M_start; pMVar6 != pMVar2; pMVar6 = pMVar6 + 1) {
    uVar1 = mvi->Dims;
    uVar4 = (ulong)uVar1;
    std::__ostream_insert<char,std::char_traits<char>>(os,"Writer: ",8);
    poVar3 = (ostream *)std::ostream::operator<<(os,pMVar6->WriterID);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Blk: ",7);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Start: {",10);
    if ((uVar4 == 0) || (pMVar6->Start == (size_t *)0x0)) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
    }
    else if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        std::ostream::_M_insert<unsigned_long>((ulong)os);
        if ((long)uVar7 < (long)(int)uVar1 + -1) {
          std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        }
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"}, Count: {",0xb);
    if ((uVar1 == 0) || (pMVar6->Count == (size_t *)0x0)) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
    }
    else if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        std::ostream::_M_insert<unsigned_long>((ulong)os);
        if ((long)uVar7 < (long)(int)uVar1 + -1) {
          std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        }
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"}, Data: ",9);
    poVar3 = std::ostream::_M_insert<void_const*>(os);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  return;
}

Assistant:

void PrintMVI(std::ostream &os, const MinVarInfo &mvi)
{
    os << "Step: " << mvi.Step << "  Dims: " << mvi.Dims << " Shape: {";
    if ((mvi.Dims == 0) || (mvi.Shape == NULL))
        os << "NULL";
    else
    {
        for (int i = 0; i < mvi.Dims; i++)
        {
            os << mvi.Shape[i];
            if (i < mvi.Dims - 1)
                os << ", ";
        }
    }
    os << "}, BlockCount: " << mvi.BlocksInfo.size() << " ";
    for (const auto &blk : mvi.BlocksInfo)
        PrintMBI(os, blk, mvi.Dims);
    os << std::endl;
}